

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O1

benchmarks_vector * __thiscall picobench::registry::benchmarks_for_current_suite(registry *this)

{
  pointer prVar1;
  char *__s2;
  char *__s1;
  int iVar2;
  rsuite *s;
  pointer prVar3;
  benchmarks_vector *unaff_R14;
  bool bVar4;
  bool bVar5;
  rsuite local_50;
  
  prVar3 = (this->_suites).super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar1 = (this->_suites).super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = prVar3 == prVar1;
  if (!bVar4) {
    __s2 = this->_current_suite_name;
    do {
      __s1 = prVar3->name;
      if (__s1 == __s2) {
        bVar5 = false;
        unaff_R14 = &prVar3->benchmarks;
      }
      else {
        bVar5 = true;
        if (__s1 != (char *)0x0 && __s2 != (char *)0x0) {
          iVar2 = strcmp(__s1,__s2);
          bVar5 = iVar2 != 0;
          if (!bVar5) {
            unaff_R14 = &prVar3->benchmarks;
          }
        }
      }
      if (!bVar5) break;
      prVar3 = prVar3 + 1;
      bVar4 = prVar3 == prVar1;
    } while (!bVar4);
  }
  if (bVar4) {
    local_50.name = this->_current_suite_name;
    local_50.benchmarks.
    super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_50.benchmarks.
    super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.benchmarks.
    super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>::
    emplace_back<picobench::rsuite>(&this->_suites,&local_50);
    std::
    vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
    ::~vector(&local_50.benchmarks);
    unaff_R14 = &(this->_suites).
                 super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].benchmarks;
  }
  return unaff_R14;
}

Assistant:

benchmarks_vector& benchmarks_for_current_suite()
    {
        for (auto& s : _suites)
        {
            if (s.name == _current_suite_name)
                return s.benchmarks;

            if (s.name && _current_suite_name && strcmp(s.name, _current_suite_name) == 0)
                return s.benchmarks;
        }
        _suites.push_back({ _current_suite_name, {} });
        return _suites.back().benchmarks;
    }